

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O1

void __thiscall
absl::strings_internal::BigUnsigned<84>::MultiplyBy
          (BigUnsigned<84> *this,int other_size,uint32_t *other_words)

{
  int iVar1;
  int original_size;
  int iVar2;
  
  original_size = this->size_;
  iVar1 = original_size + other_size;
  if (1 < iVar1) {
    iVar2 = 0x55;
    if (iVar1 < 0x55) {
      iVar2 = iVar1;
    }
    iVar2 = iVar2 + -1;
    do {
      iVar2 = iVar2 + -1;
      MultiplyStep(this,original_size,other_words,other_size,iVar2);
    } while (0 < iVar2);
  }
  return;
}

Assistant:

void MultiplyBy(int other_size, const uint32_t* other_words) {
    const int original_size = size_;
    const int first_step =
        (std::min)(original_size + other_size - 2, max_words - 1);
    for (int step = first_step; step >= 0; --step) {
      MultiplyStep(original_size, other_words, other_size, step);
    }
  }